

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O1

Vector __thiscall KNNClassifier::predict(KNNClassifier *this,SparseMatrix *X)

{
  uint uVar1;
  SparseMatrix *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar2;
  long lVar3;
  Vector VVar4;
  
  lVar3 = in_RDX->m_outerSize;
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->matrizX = 0;
  if (lVar3 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar3,lVar3,1);
  IVar2 = extraout_RDX;
  if (0 < in_RDX->m_outerSize) {
    lVar3 = 0;
    do {
      uVar1 = predecirFila((KNNClassifier *)X,in_RDX,(int)lVar3);
      if (*(long *)&this->matrizX <= lVar3) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(double *)(*(long *)this + lVar3 * 8) = (double)(int)uVar1;
      lVar3 = lVar3 + 1;
      IVar2 = extraout_RDX_00;
    } while (lVar3 < in_RDX->m_outerSize);
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector KNNClassifier::predict(SparseMatrix X)
{
  auto result = Vector(X.rows());

  for (int i = 0; i < X.rows(); i++)
    result(i) = predecirFila(X, i);

  return result;
}